

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O1

char * fmt::v8::detail::
       parse_precision<char,fmt::v8::detail::specs_checker<fmt::v8::detail::dynamic_specs_handler<fmt::v8::basic_format_parse_context<char,fmt::v8::detail::error_handler>>>&>
                 (char *begin,char *end,
                 specs_checker<fmt::v8::detail::dynamic_specs_handler<fmt::v8::basic_format_parse_context<char,_fmt::v8::detail::error_handler>_>_>
                 *handler)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  char *local_28;
  precision_adapter local_20;
  
  local_28 = begin + 1;
  if (local_28 == end) {
    iVar2 = 0;
  }
  else {
    iVar2 = (int)*local_28;
  }
  if (iVar2 - 0x30U < 10) {
    iVar2 = parse_nonnegative_int<char>(&local_28,end,-1);
    if (iVar2 == -1) {
      error_handler::on_error
                ((error_handler *)
                 (handler->
                 super_dynamic_specs_handler<fmt::v8::basic_format_parse_context<char,_fmt::v8::detail::error_handler>_>
                 ).context_,"number is too big");
    }
    ((handler->
     super_dynamic_specs_handler<fmt::v8::basic_format_parse_context<char,_fmt::v8::detail::error_handler>_>
     ).super_specs_setter<char>.specs_)->precision = iVar2;
  }
  else {
    if (iVar2 != 0x7b) {
      error_handler::on_error
                ((error_handler *)
                 (handler->
                 super_dynamic_specs_handler<fmt::v8::basic_format_parse_context<char,_fmt::v8::detail::error_handler>_>
                 ).context_,"missing precision specifier");
    }
    pcVar3 = begin + 2;
    local_28 = pcVar3;
    if (pcVar3 != end) {
      local_20.handler = handler;
      if ((*pcVar3 == ':') || (*pcVar3 == '}')) {
        dynamic_specs_handler<fmt::v8::basic_format_parse_context<char,_fmt::v8::detail::error_handler>_>
        ::on_dynamic_precision<fmt::v8::detail::auto_id>
                  (&handler->
                    super_dynamic_specs_handler<fmt::v8::basic_format_parse_context<char,_fmt::v8::detail::error_handler>_>
                  );
        local_28 = pcVar3;
      }
      else {
        local_28 = do_parse_arg_id<char,fmt::v8::detail::parse_precision<char,fmt::v8::detail::specs_checker<fmt::v8::detail::dynamic_specs_handler<fmt::v8::basic_format_parse_context<char,fmt::v8::detail::error_handler>>>&>(char_const*,char_const*,fmt::v8::detail::specs_checker<fmt::v8::detail::dynamic_specs_handler<fmt::v8::basic_format_parse_context<char,fmt::v8::detail::error_handler>>>&)::precision_adapter&>
                             (pcVar3,end,&local_20);
      }
    }
    if ((local_28 == end) ||
       (pcVar3 = local_28 + 1, cVar1 = *local_28, local_28 = pcVar3, cVar1 != '}')) {
      error_handler::on_error
                ((error_handler *)
                 (handler->
                 super_dynamic_specs_handler<fmt::v8::basic_format_parse_context<char,_fmt::v8::detail::error_handler>_>
                 ).context_,"invalid format string");
    }
  }
  if ((handler->arg_type_ < custom_type) && ((0x41feU >> (handler->arg_type_ & 0x1f) & 1) != 0)) {
    error_handler::on_error
              ((error_handler *)
               (handler->
               super_dynamic_specs_handler<fmt::v8::basic_format_parse_context<char,_fmt::v8::detail::error_handler>_>
               ).context_,"precision not allowed for this argument type");
  }
  return local_28;
}

Assistant:

FMT_CONSTEXPR auto parse_precision(const Char* begin, const Char* end,
                                   Handler&& handler) -> const Char* {
  using detail::auto_id;
  struct precision_adapter {
    Handler& handler;

    FMT_CONSTEXPR void operator()() { handler.on_dynamic_precision(auto_id()); }
    FMT_CONSTEXPR void operator()(int id) { handler.on_dynamic_precision(id); }
    FMT_CONSTEXPR void operator()(basic_string_view<Char> id) {
      handler.on_dynamic_precision(id);
    }
    FMT_CONSTEXPR void on_error(const char* message) {
      if (message) handler.on_error(message);
    }
  };

  ++begin;
  auto c = begin != end ? *begin : Char();
  if ('0' <= c && c <= '9') {
    auto precision = parse_nonnegative_int(begin, end, -1);
    if (precision != -1)
      handler.on_precision(precision);
    else
      handler.on_error("number is too big");
  } else if (c == '{') {
    ++begin;
    if (begin != end)
      begin = parse_arg_id(begin, end, precision_adapter{handler});
    if (begin == end || *begin++ != '}')
      return handler.on_error("invalid format string"), begin;
  } else {
    return handler.on_error("missing precision specifier"), begin;
  }
  handler.end_precision();
  return begin;
}